

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.hpp
# Opt level: O2

void __thiscall antlr::CommonToken::CommonToken(CommonToken *this,string *s)

{
  (this->super_Token).ref = (TokenRef *)0x0;
  (this->super_Token).type = 0;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__CommonToken_001feca8;
  *(undefined8 *)&(this->super_Token).field_0x14 = 0x100000001;
  std::__cxx11::string::string((string *)&this->text,(string *)s);
  return;
}

Assistant:

Token()
	: ref(0)
	, type(INVALID_TYPE)
	{
	}